

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uTimer.cpp
# Opt level: O0

void __thiscall UTimer::~UTimer(UTimer *this)

{
  ostream *poVar1;
  long in_RDI;
  rep msec;
  rep usec;
  duration<double,_std::ratio<1L,_1L>_> *in_stack_ffffffffffffff58;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  *in_stack_ffffffffffffff60;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  *in_stack_ffffffffffffff68;
  duration<double,_std::ratio<1L,_1L>_> *in_stack_ffffffffffffff70;
  duration<long,_std::ratio<1L,_1000L>_> local_40;
  rep local_38;
  duration<long,_std::ratio<1L,_1000000L>_> local_30;
  rep local_28;
  rep local_20;
  undefined8 local_18;
  undefined8 local_10;
  
  local_10 = std::chrono::_V2::system_clock::now();
  *(undefined8 *)(in_RDI + 8) = local_10;
  local_20 = (rep)std::chrono::operator-(in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
  std::chrono::duration<double,std::ratio<1l,1l>>::duration<long,std::ratio<1l,1000000000l>,void>
            (in_stack_ffffffffffffff70,&in_stack_ffffffffffffff68->__d);
  *(undefined8 *)(in_RDI + 0x10) = local_18;
  local_30.__r = (rep)std::chrono::
                      duration_cast<std::chrono::duration<long,std::ratio<1l,1000000l>>,double,std::ratio<1l,1l>>
                                (in_stack_ffffffffffffff58);
  local_28 = std::chrono::duration<long,_std::ratio<1L,_1000000L>_>::count(&local_30);
  local_40.__r = (rep)std::chrono::
                      duration_cast<std::chrono::duration<long,std::ratio<1l,1000l>>,double,std::ratio<1l,1l>>
                                (in_stack_ffffffffffffff58);
  local_38 = std::chrono::duration<long,_std::ratio<1L,_1000L>_>::count(&local_40);
  poVar1 = std::operator<<((ostream *)&std::cout,(string *)(in_RDI + 0x18));
  poVar1 = std::operator<<(poVar1," computed in ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_28);
  poVar1 = std::operator<<(poVar1," usec  (");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_38);
  poVar1 = std::operator<<(poVar1," milliseconds)");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string((string *)(in_RDI + 0x18));
  return;
}

Assistant:

UTimer::~UTimer () {
	stop		= std::chrono::high_resolution_clock::now();
	elapsedTime	= stop - start;
	auto usec	= std::chrono::duration_cast<usecs>(elapsedTime).count();
	auto msec	= std::chrono::duration_cast<msecs>(elapsedTime).count();
	
	std::cout << message << " computed in " << usec << " usec  (" << msec << " milliseconds)" << std::endl;
}